

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QNetworkAuthenticationCredential>::moveAppend
          (QGenericArrayOps<QNetworkAuthenticationCredential> *this,
          QNetworkAuthenticationCredential *b,QNetworkAuthenticationCredential *e)

{
  qsizetype *pqVar1;
  QNetworkAuthenticationCredential *pQVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QNetworkAuthenticationCredential>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QNetworkAuthenticationCredential>).size;
      pDVar4 = (b->domain).d.d;
      (b->domain).d.d = (Data *)0x0;
      pQVar2[lVar3].domain.d.d = pDVar4;
      pcVar5 = (b->domain).d.ptr;
      (b->domain).d.ptr = (char16_t *)0x0;
      pQVar2[lVar3].domain.d.ptr = pcVar5;
      qVar6 = (b->domain).d.size;
      (b->domain).d.size = 0;
      pQVar2[lVar3].domain.d.size = qVar6;
      pDVar4 = (b->user).d.d;
      (b->user).d.d = (Data *)0x0;
      pQVar2[lVar3].user.d.d = pDVar4;
      pcVar5 = (b->user).d.ptr;
      (b->user).d.ptr = (char16_t *)0x0;
      pQVar2[lVar3].user.d.ptr = pcVar5;
      qVar6 = (b->user).d.size;
      (b->user).d.size = 0;
      pQVar2[lVar3].user.d.size = qVar6;
      pDVar4 = (b->password).d.d;
      (b->password).d.d = (Data *)0x0;
      pQVar2[lVar3].password.d.d = pDVar4;
      pcVar5 = (b->password).d.ptr;
      (b->password).d.ptr = (char16_t *)0x0;
      pQVar2[lVar3].password.d.ptr = pcVar5;
      qVar6 = (b->password).d.size;
      (b->password).d.size = 0;
      pQVar2[lVar3].password.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QNetworkAuthenticationCredential>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }